

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
string_assertion_test::iu_StrTest_x_iutest_x_EqString_Test<char>::
~iu_StrTest_x_iutest_x_EqString_Test(iu_StrTest_x_iutest_x_EqString_Test<char> *this)

{
  iu_StrTest_x_iutest_x_EqString_Test<char> *this_local;
  
  ~iu_StrTest_x_iutest_x_EqString_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STREQ(test1, test2);
    IUTEST_INFORM_STREQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STREQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STREQ(test1, test2);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STREQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STREQ(test1, test2);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, test2);
}